

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O0

bool google::protobuf::compiler::annotation_test_util::AtLeastOneAnnotationMatchesSubstring
               (string *file_content,
               vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               *annotations,string *expected_text,
               optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic> semantic)

{
  bool bVar1;
  __type _Var2;
  GeneratedCodeInfo_Annotation_Semantic GVar3;
  reference ppGVar4;
  ulong uVar5;
  ulong uVar6;
  GeneratedCodeInfo_Annotation_Semantic *pGVar7;
  bool local_7a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  uint local_50;
  uint local_4c;
  uint32_t end;
  uint32_t begin;
  Annotation *annotation;
  const_iterator e;
  const_iterator i;
  string *expected_text_local;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  *annotations_local;
  string *file_content_local;
  optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic> semantic_local;
  
  unique0x10000164 =
       (_Optional_payload_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>)
       semantic.
       super__Optional_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_true,_true>.
       _M_payload.
       super__Optional_payload_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>;
  e = std::
      vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ::begin(annotations);
  annotation = (Annotation *)
               std::
               vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               ::end(annotations);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&e,(__normal_iterator<const_google::protobuf::GeneratedCodeInfo_Annotation_*const_*,_std::vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>_>
                           *)&annotation);
    if (!bVar1) {
      return false;
    }
    ppGVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::GeneratedCodeInfo_Annotation_*const_*,_std::vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>_>
              ::operator*(&e);
    _end = *ppGVar4;
    local_4c = GeneratedCodeInfo_Annotation::begin(_end);
    local_50 = GeneratedCodeInfo_Annotation::end(_end);
    if ((local_50 < local_4c) ||
       (uVar5 = (ulong)local_50, uVar6 = std::__cxx11::string::size(), uVar6 < uVar5)) break;
    std::__cxx11::string::substr((ulong)&local_70,(ulong)file_content);
    _Var2 = std::operator==(&local_70,expected_text);
    std::__cxx11::string::~string((string *)&local_70);
    if (_Var2) {
      bVar1 = std::optional::operator_cast_to_bool((optional *)((long)&file_content_local + 4));
      local_7a = true;
      if (bVar1) {
        GVar3 = GeneratedCodeInfo_Annotation::semantic(_end);
        pGVar7 = std::optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>::operator*
                           ((optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic> *)
                            ((long)&file_content_local + 4));
        local_7a = GVar3 == *pGVar7;
      }
      return local_7a;
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::GeneratedCodeInfo_Annotation_*const_*,_std::vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>_>
    ::operator++(&e);
  }
  return false;
}

Assistant:

bool AtLeastOneAnnotationMatchesSubstring(
    const std::string& file_content,
    const std::vector<const GeneratedCodeInfo::Annotation*>& annotations,
    const std::string& expected_text,
    absl::optional<GeneratedCodeInfo::Annotation::Semantic> semantic) {
  for (std::vector<const GeneratedCodeInfo::Annotation*>::const_iterator
           i = annotations.begin(),
           e = annotations.end();
       i != e; ++i) {
    const GeneratedCodeInfo::Annotation* annotation = *i;
    uint32_t begin = annotation->begin();
    uint32_t end = annotation->end();
    if (end < begin || end > file_content.size()) {
      return false;
    }
    if (file_content.substr(begin, end - begin) == expected_text) {
      return !semantic || annotation->semantic() == *semantic;
    }
  }
  return false;
}